

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void __thiscall tinyexr::anon_struct_128_15_3efe3611::clear(anon_struct_128_15_3efe3611 *this)

{
  pointer p_Var1;
  
  std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::clear(&this->channels);
  p_Var1 = (this->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var1) {
    (this->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
    super__Vector_impl_data._M_finish = p_Var1;
  }
  this->tile_level_mode = 0;
  this->tile_rounding_mode = 0;
  this->header_len = 0;
  this->compression_type = 0;
  this->pixel_aspect_ratio = 0.0;
  this->chunk_count = 0;
  this->tile_size_x = 0;
  this->tile_size_y = 0;
  *(undefined8 *)(this->display_window + 3) = 0;
  *(undefined8 *)(this->screen_window_center + 1) = 0;
  this->line_order = 0;
  this->display_window[0] = 0;
  this->display_window[1] = 0;
  this->display_window[2] = 0;
  this->data_window[0] = 0;
  this->data_window[1] = 0;
  this->data_window[2] = 0;
  this->data_window[3] = 0;
  return;
}

Assistant:

void clear() {
    channels.clear();
    attributes.clear();

    data_window[0] = 0;
    data_window[1] = 0;
    data_window[2] = 0;
    data_window[3] = 0;
    line_order = 0;
    display_window[0] = 0;
    display_window[1] = 0;
    display_window[2] = 0;
    display_window[3] = 0;
    screen_window_center[0] = 0.0f;
    screen_window_center[1] = 0.0f;
    screen_window_width = 0.0f;
    pixel_aspect_ratio = 0.0f;

    chunk_count = 0;

    // Tiled format
    tile_size_x = 0;
    tile_size_y = 0;
    tile_level_mode = 0;
    tile_rounding_mode = 0;

    header_len = 0;
    compression_type = 0;
  }